

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaElementPtr
xmlSchemaCheckSubstGroupCircular(xmlSchemaElementPtr elemDecl,xmlSchemaElementPtr ancestor)

{
  int *piVar1;
  xmlSchemaElementPtr pxVar2;
  
  pxVar2 = ancestor->refDecl;
  if (pxVar2 != (xmlSchemaElementPtr)0x0) {
    if (pxVar2 == elemDecl) {
      return ancestor;
    }
    if (((uint)pxVar2->flags >> 9 & 1) == 0) {
      pxVar2->flags = pxVar2->flags | 0x200;
      pxVar2 = xmlSchemaCheckSubstGroupCircular(elemDecl,pxVar2);
      piVar1 = &ancestor->refDecl->flags;
      *piVar1 = *piVar1 ^ 0x200;
      return pxVar2;
    }
  }
  return (xmlSchemaElementPtr)0x0;
}

Assistant:

static xmlSchemaElementPtr
xmlSchemaCheckSubstGroupCircular(xmlSchemaElementPtr elemDecl,
				 xmlSchemaElementPtr ancestor)
{
    xmlSchemaElementPtr ret;

    if (WXS_SUBST_HEAD(ancestor) == NULL)
	return (NULL);
    if (WXS_SUBST_HEAD(ancestor) == elemDecl)
	return (ancestor);

    if (WXS_SUBST_HEAD(ancestor)->flags & XML_SCHEMAS_ELEM_CIRCULAR)
	return (NULL);
    WXS_SUBST_HEAD(ancestor)->flags |= XML_SCHEMAS_ELEM_CIRCULAR;
    ret = xmlSchemaCheckSubstGroupCircular(elemDecl,
	WXS_SUBST_HEAD(ancestor));
    WXS_SUBST_HEAD(ancestor)->flags ^= XML_SCHEMAS_ELEM_CIRCULAR;

    return (ret);
}